

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O0

void __thiscall FM::OPNB::OPNB(OPNB *this)

{
  Channel4 *local_28;
  int local_20;
  int i;
  OPNB *this_local;
  
  OPNABase::OPNABase(&this->super_OPNABase);
  (this->super_OPNABase).super_OPNBase.super_Timer._vptr_Timer =
       (_func_int **)&PTR_SetStatus_002fbba8;
  local_28 = (Channel4 *)&this->field_0x14d8;
  do {
    Channel4::Channel4(local_28);
    local_28 = local_28 + 1;
  } while ((OPNB *)local_28 != this + 1);
  this->adpcmabuf = (uint8 *)0x0;
  this->adpcmasize = 0;
  for (local_20 = 0; local_20 < 6; local_20 = local_20 + 1) {
    this->adpcma[local_20].pan = '\0';
    this->adpcma[local_20].level = '\0';
    this->adpcma[local_20].volume = 0;
    this->adpcma[local_20].pos = 0;
    this->adpcma[local_20].step = 0;
    this->adpcma[local_20].volume = 0;
    this->adpcma[local_20].start = 0;
    this->adpcma[local_20].stop = 0;
    this->adpcma[local_20].adpcmx = 0;
    this->adpcma[local_20].adpcmd = 0;
  }
  this->adpcmatl = '\0';
  this->adpcmakey = '\0';
  this->adpcmatvol = 0;
  (this->super_OPNABase).adpcmmask = 0;
  (this->super_OPNABase).adpcmnotice = 0x8000;
  (this->super_OPNABase).granuality = -1;
  (this->super_OPNABase).super_OPNBase.csmch = (Channel4 *)&this->field_0x1a98;
  InitADPCMATable();
  return;
}

Assistant:

OPNB::OPNB()
{
	adpcmabuf = 0;
	adpcmasize = 0;
	for (int i=0; i<6; i++)
	{
		adpcma[i].pan = 0;
		adpcma[i].level = 0;
		adpcma[i].volume = 0;
		adpcma[i].pos = 0;
		adpcma[i].step = 0;
		adpcma[i].volume = 0;
		adpcma[i].start = 0;
		adpcma[i].stop = 0;
		adpcma[i].adpcmx = 0;
		adpcma[i].adpcmd = 0;
	}
	adpcmatl = 0;
	adpcmakey = 0;
	adpcmatvol = 0;
	adpcmmask = 0;
	adpcmnotice = 0x8000;
	granuality = -1;
	csmch = &ch[2];

	InitADPCMATable();
}